

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O1

bool tinyusdz::LoadLayerFromAsset
               (AssetResolutionResolver *resolver,string *resolved_asset_name,Layer *layer,
               string *warn,string *err,USDLoadOptions *options)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  ostream *poVar3;
  Asset *asset_out;
  Asset asset;
  ostringstream ss_e;
  Asset local_260;
  long *local_1e8 [2];
  long local_1d8 [2];
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  if (resolved_asset_name->_M_string_length == 0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1a8);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tinyusdz.cc",
               0x52);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"LoadLayerFromAsset",0x12);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x554);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Input asset name is empty.",0x1a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_260.version_._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260.version_._M_dataplus._M_p != &local_260.version_.field_2) {
        operator_delete(local_260.version_._M_dataplus._M_p,
                        CONCAT71(local_260.version_.field_2._M_allocated_capacity._1_7_,
                                 local_260.version_.field_2._M_local_buf[0]) + 1);
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
    ::std::ios_base::~ios_base(local_138);
    bVar2 = false;
  }
  else {
    if ((ulong)options->max_allowed_asset_size_in_mb != 0) {
      *(ulong *)(resolver + 0x40) = (ulong)options->max_allowed_asset_size_in_mb;
    }
    local_260.version_._M_dataplus._M_p = (pointer)&local_260.version_.field_2;
    local_260.version_._M_string_length = 0;
    local_260.version_.field_2._M_local_buf[0] = '\0';
    local_260.name_._M_dataplus._M_p = (pointer)&local_260.name_.field_2;
    local_260.name_._M_string_length = 0;
    local_260.name_.field_2._M_local_buf[0] = '\0';
    paVar1 = &local_260.resolved_name_.field_2;
    local_260.resolved_name_._M_string_length = 0;
    local_260.resolved_name_.field_2._M_local_buf[0] = '\0';
    local_260.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uint8_t *)0x0;
    local_260.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_260.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    asset_out = &local_260;
    local_260.resolved_name_._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = AssetResolutionResolver::open_asset
                      (resolver,resolved_asset_name,resolved_asset_name,asset_out,warn,err);
    if (bVar2) {
      bVar2 = LoadLayerFromMemory(local_260.buf_.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_260.buf_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_260.buf_.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start,
                                  resolved_asset_name,layer,warn,err,options);
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_1a8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tinyusdz.cc"
                 ,0x52);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"LoadLayerFromAsset",0x12);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
      poVar3 = (ostream *)::std::ostream::operator<<(local_1a8,0x55b);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      local_1e8[0] = local_1d8;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1e8,"Failed to open asset `{}`.","");
      fmt::format<std::__cxx11::string>
                (&local_1c8,(fmt *)local_1e8,resolved_asset_name,&asset_out->version_);
      poVar3 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
      if (local_1e8[0] != local_1d8) {
        operator_delete(local_1e8[0],local_1d8[0] + 1);
      }
      if (err != (string *)0x0) {
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)err,(ulong)local_1c8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
      }
      ::std::__cxx11::ostringstream::~ostringstream(local_1a8);
      ::std::ios_base::~ios_base(local_138);
      bVar2 = false;
    }
    if (local_260.buf_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uint8_t *)0x0) {
      operator_delete(local_260.buf_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_260.buf_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_260.buf_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.resolved_name_._M_dataplus._M_p != paVar1) {
      operator_delete(local_260.resolved_name_._M_dataplus._M_p,
                      CONCAT71(local_260.resolved_name_.field_2._M_allocated_capacity._1_7_,
                               local_260.resolved_name_.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.name_._M_dataplus._M_p != &local_260.name_.field_2) {
      operator_delete(local_260.name_._M_dataplus._M_p,
                      CONCAT71(local_260.name_.field_2._M_allocated_capacity._1_7_,
                               local_260.name_.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260.version_._M_dataplus._M_p != &local_260.version_.field_2) {
      operator_delete(local_260.version_._M_dataplus._M_p,
                      CONCAT71(local_260.version_.field_2._M_allocated_capacity._1_7_,
                               local_260.version_.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar2;
}

Assistant:

bool LoadLayerFromAsset(AssetResolutionResolver &resolver, const std::string &resolved_asset_name, Layer *layer,
                     std::string *warn, std::string *err,
                     const USDLoadOptions &options) {

  if (resolved_asset_name.empty()) {
    PUSH_ERROR_AND_RETURN("Input asset name is empty.");
  }

  resolver.set_max_asset_bytes_in_mb(options.max_allowed_asset_size_in_mb);

  Asset asset;
  if (!resolver.open_asset(resolved_asset_name, resolved_asset_name, &asset, warn, err)) {
    PUSH_ERROR_AND_RETURN(fmt::format("Failed to open asset `{}`.", resolved_asset_name));
  }

  return LoadLayerFromMemory(asset.data(), asset.size(), resolved_asset_name, layer, warn, err,
                           options);
}